

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<char> * __thiscall
cimg_library::CImgList<char>::get_append
          (CImg<char> *__return_storage_ptr__,CImgList<char> *this,char axis,float align)

{
  char **ppcVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  CImg<char> *pCVar5;
  void *pvVar6;
  char cVar7;
  long lVar8;
  CImg<char> *pCVar9;
  uint uVar10;
  uint uVar11;
  CImgList<char> *pCVar12;
  ulong uVar13;
  uint uVar14;
  int l;
  long lVar15;
  int l_2;
  uint uVar16;
  char local_4c [4];
  CImgList<char> *local_48;
  float local_3c;
  CImg<char> *local_38;
  
  pCVar9 = this->_data;
  uVar11 = this->_width;
  if (uVar11 == 0 || pCVar9 == (CImg<char> *)0x0) {
    __return_storage_ptr__->_data = (char *)0x0;
    __return_storage_ptr__->_width = 0;
    __return_storage_ptr__->_height = 0;
    __return_storage_ptr__->_depth = 0;
    __return_storage_ptr__->_spectrum = 0;
    __return_storage_ptr__->_is_shared = false;
  }
  else {
    uVar13 = (ulong)uVar11;
    local_3c = align;
    if (uVar11 == 1) {
      CImg<char>::CImg(__return_storage_ptr__,pCVar9,false);
    }
    else {
      __return_storage_ptr__->_data = (char *)0x0;
      __return_storage_ptr__->_width = 0;
      __return_storage_ptr__->_height = 0;
      __return_storage_ptr__->_depth = 0;
      __return_storage_ptr__->_spectrum = 0;
      __return_storage_ptr__->_is_shared = false;
      cVar7 = axis + ' ';
      if ((byte)(axis + 0xa5U) < 0xe6) {
        cVar7 = axis;
      }
      local_48 = this;
      local_38 = __return_storage_ptr__;
      if (cVar7 == 'x') {
        if ((int)uVar11 < 1) {
          uVar10 = 0;
          uVar14 = 0;
          uVar11 = 0;
          uVar16 = 0;
        }
        else {
          lVar8 = 0;
          uVar16 = 0;
          uVar11 = 0;
          uVar14 = 0;
          uVar10 = 0;
          do {
            if (*(long *)((long)&pCVar9->_data + lVar8) != 0) {
              uVar10 = uVar10 + *(int *)((long)&pCVar9->_width + lVar8);
              uVar2 = *(uint *)((long)&pCVar9->_height + lVar8);
              uVar3 = *(uint *)((long)&pCVar9->_depth + lVar8);
              if (uVar14 <= uVar2) {
                uVar14 = uVar2;
              }
              if (uVar11 <= uVar3) {
                uVar11 = uVar3;
              }
              uVar2 = *(uint *)((long)&pCVar9->_spectrum + lVar8);
              if (uVar16 <= uVar2) {
                uVar16 = uVar2;
              }
            }
            lVar8 = lVar8 + 0x20;
          } while (uVar13 << 5 != lVar8);
        }
        local_4c[3] = 0;
        pCVar9 = CImg<char>::assign(__return_storage_ptr__,uVar10,uVar14,uVar11,uVar16);
        CImg<char>::fill(pCVar9,local_4c + 3);
        ppcVar1 = &__return_storage_ptr__->_data;
        __return_storage_ptr__ = local_38;
        if ((*ppcVar1 != (char *)0x0) && (0 < (int)local_48->_width)) {
          lVar8 = 0;
          lVar15 = 0;
          uVar13 = 0;
          pCVar12 = local_48;
          do {
            pCVar5 = pCVar12->_data;
            pCVar9 = (CImg<char> *)((long)&pCVar5->_width + lVar8);
            pvVar6 = *(void **)((long)&pCVar5->_data + lVar8);
            if (pvVar6 != (void *)0x0) {
              iVar4 = *(int *)((long)&pCVar5->_height + lVar8);
              if ((((iVar4 == 1) && (*(int *)((long)&pCVar5->_depth + lVar8) == 1)) &&
                  (*(int *)((long)&pCVar5->_spectrum + lVar8) == 1)) &&
                 (((local_38->_height == 1 && (local_38->_depth == 1)) && (local_38->_spectrum == 1)
                  ))) {
                memcpy(local_38->_data + uVar13,pvVar6,(ulong)pCVar9->_width);
                pCVar12 = local_48;
              }
              else {
                CImg<char>::draw_image
                          (local_38,(int)uVar13,(int)((float)(uVar14 - iVar4) * local_3c),
                           (int)((float)(uVar11 - *(int *)((long)&pCVar5->_depth + lVar8)) *
                                local_3c),
                           (int)((float)(uVar16 - *(int *)((long)&pCVar5->_spectrum + lVar8)) *
                                local_3c),pCVar9,1.0);
                pCVar12 = local_48;
              }
            }
            uVar13 = (ulong)((int)uVar13 + pCVar9->_width);
            lVar15 = lVar15 + 1;
            lVar8 = lVar8 + 0x20;
            __return_storage_ptr__ = local_38;
          } while (lVar15 < (int)pCVar12->_width);
        }
      }
      else if (cVar7 == 'y') {
        if ((int)uVar11 < 1) {
          uVar11 = 0;
          uVar10 = 0;
          uVar14 = 0;
          uVar16 = 0;
        }
        else {
          lVar8 = 0;
          uVar16 = 0;
          uVar14 = 0;
          uVar10 = 0;
          uVar11 = 0;
          do {
            if (*(long *)((long)&pCVar9->_data + lVar8) != 0) {
              uVar2 = *(uint *)((long)&pCVar9->_width + lVar8);
              if (uVar11 <= uVar2) {
                uVar11 = uVar2;
              }
              uVar2 = *(uint *)((long)&pCVar9->_depth + lVar8);
              uVar10 = uVar10 + *(int *)((long)&pCVar9->_height + lVar8);
              if (uVar14 <= uVar2) {
                uVar14 = uVar2;
              }
              uVar2 = *(uint *)((long)&pCVar9->_spectrum + lVar8);
              if (uVar16 <= uVar2) {
                uVar16 = uVar2;
              }
            }
            lVar8 = lVar8 + 0x20;
          } while (uVar13 << 5 != lVar8);
        }
        local_4c[2] = 0;
        pCVar9 = CImg<char>::assign(__return_storage_ptr__,uVar11,uVar10,uVar14,uVar16);
        CImg<char>::fill(pCVar9,local_4c + 2);
        ppcVar1 = &__return_storage_ptr__->_data;
        __return_storage_ptr__ = local_38;
        if ((*ppcVar1 != (char *)0x0) && (0 < (int)local_48->_width)) {
          lVar8 = 0;
          lVar15 = 0;
          uVar13 = 0;
          pCVar12 = local_48;
          do {
            pCVar9 = pCVar12->_data;
            pvVar6 = *(void **)((long)&pCVar9->_data + lVar8);
            if (pvVar6 != (void *)0x0) {
              pCVar5 = (CImg<char> *)((long)&pCVar9->_width + lVar8);
              uVar10 = pCVar5->_width;
              if (((((uVar10 == 1) && (*(int *)((long)&pCVar9->_depth + lVar8) == 1)) &&
                   (*(int *)((long)&pCVar9->_spectrum + lVar8) == 1)) &&
                  ((local_38->_width == 1 && (local_38->_depth == 1)))) &&
                 (local_38->_spectrum == 1)) {
                memcpy(local_38->_data + uVar13,pvVar6,
                       (ulong)*(uint *)((long)&pCVar9->_height + lVar8));
                pCVar12 = local_48;
              }
              else {
                CImg<char>::draw_image
                          (local_38,(int)((float)(uVar11 - uVar10) * local_3c),(int)uVar13,
                           (int)((float)(uVar14 - *(int *)((long)&pCVar9->_depth + lVar8)) *
                                local_3c),
                           (int)((float)(uVar16 - *(int *)((long)&pCVar9->_spectrum + lVar8)) *
                                local_3c),pCVar5,1.0);
                pCVar12 = local_48;
              }
            }
            uVar13 = (ulong)(uint)((int)uVar13 + *(int *)((long)&pCVar9->_height + lVar8));
            lVar15 = lVar15 + 1;
            lVar8 = lVar8 + 0x20;
            __return_storage_ptr__ = local_38;
          } while (lVar15 < (int)pCVar12->_width);
        }
      }
      else if (cVar7 == 'z') {
        if ((int)uVar11 < 1) {
          uVar11 = 0;
          uVar14 = 0;
          uVar10 = 0;
          uVar16 = 0;
        }
        else {
          lVar8 = 0;
          uVar16 = 0;
          uVar10 = 0;
          uVar14 = 0;
          uVar11 = 0;
          do {
            if (*(long *)((long)&pCVar9->_data + lVar8) != 0) {
              uVar2 = *(uint *)((long)&pCVar9->_width + lVar8);
              uVar3 = *(uint *)((long)&pCVar9->_height + lVar8);
              if (uVar11 <= uVar2) {
                uVar11 = uVar2;
              }
              if (uVar14 <= uVar3) {
                uVar14 = uVar3;
              }
              uVar10 = uVar10 + *(int *)((long)&pCVar9->_depth + lVar8);
              uVar2 = *(uint *)((long)&pCVar9->_spectrum + lVar8);
              if (uVar16 <= uVar2) {
                uVar16 = uVar2;
              }
            }
            lVar8 = lVar8 + 0x20;
          } while (uVar13 << 5 != lVar8);
        }
        local_4c[1] = 0;
        pCVar9 = CImg<char>::assign(__return_storage_ptr__,uVar11,uVar14,uVar10,uVar16);
        CImg<char>::fill(pCVar9,local_4c + 1);
        ppcVar1 = &__return_storage_ptr__->_data;
        __return_storage_ptr__ = local_38;
        if ((*ppcVar1 != (char *)0x0) && (0 < (int)local_48->_width)) {
          lVar8 = 0;
          lVar15 = 0;
          uVar13 = 0;
          pCVar12 = local_48;
          do {
            pCVar9 = pCVar12->_data;
            pvVar6 = *(void **)((long)&pCVar9->_data + lVar8);
            if (pvVar6 != (void *)0x0) {
              pCVar5 = (CImg<char> *)((long)&pCVar9->_width + lVar8);
              uVar10 = pCVar5->_width;
              if (((((uVar10 == 1) && (*(int *)((long)&pCVar9->_height + lVar8) == 1)) &&
                   (*(int *)((long)&pCVar9->_spectrum + lVar8) == 1)) &&
                  ((local_38->_width == 1 && (local_38->_height == 1)))) &&
                 (local_38->_spectrum == 1)) {
                memcpy(local_38->_data + uVar13,pvVar6,
                       (ulong)*(uint *)((long)&pCVar9->_depth + lVar8));
                pCVar12 = local_48;
              }
              else {
                CImg<char>::draw_image
                          (local_38,(int)((float)(uVar11 - uVar10) * local_3c),
                           (int)((float)(uVar14 - *(int *)((long)&pCVar9->_height + lVar8)) *
                                local_3c),(int)uVar13,
                           (int)((float)(uVar16 - *(int *)((long)&pCVar9->_spectrum + lVar8)) *
                                local_3c),pCVar5,1.0);
                pCVar12 = local_48;
              }
            }
            uVar13 = (ulong)(uint)((int)uVar13 + *(int *)((long)&pCVar9->_depth + lVar8));
            lVar15 = lVar15 + 1;
            lVar8 = lVar8 + 0x20;
            __return_storage_ptr__ = local_38;
          } while (lVar15 < (int)pCVar12->_width);
        }
      }
      else {
        if ((int)uVar11 < 1) {
          uVar11 = 0;
          uVar14 = 0;
          uVar16 = 0;
          uVar10 = 0;
        }
        else {
          lVar8 = 0;
          uVar10 = 0;
          uVar16 = 0;
          uVar14 = 0;
          uVar11 = 0;
          do {
            if (*(long *)((long)&pCVar9->_data + lVar8) != 0) {
              uVar2 = *(uint *)((long)&pCVar9->_width + lVar8);
              uVar3 = *(uint *)((long)&pCVar9->_height + lVar8);
              if (uVar11 <= uVar2) {
                uVar11 = uVar2;
              }
              if (uVar14 <= uVar3) {
                uVar14 = uVar3;
              }
              uVar2 = *(uint *)((long)&pCVar9->_depth + lVar8);
              if (uVar16 <= uVar2) {
                uVar16 = uVar2;
              }
              uVar10 = uVar10 + *(int *)((long)&pCVar9->_spectrum + lVar8);
            }
            lVar8 = lVar8 + 0x20;
          } while (uVar13 << 5 != lVar8);
        }
        local_4c[0] = '\0';
        pCVar9 = CImg<char>::assign(__return_storage_ptr__,uVar11,uVar14,uVar16,uVar10);
        CImg<char>::fill(pCVar9,local_4c);
        ppcVar1 = &__return_storage_ptr__->_data;
        __return_storage_ptr__ = local_38;
        if ((*ppcVar1 != (char *)0x0) && (0 < (int)local_48->_width)) {
          lVar8 = 0;
          lVar15 = 0;
          uVar13 = 0;
          pCVar12 = local_48;
          do {
            pCVar9 = pCVar12->_data;
            pvVar6 = *(void **)((long)&pCVar9->_data + lVar8);
            if (pvVar6 != (void *)0x0) {
              pCVar5 = (CImg<char> *)((long)&pCVar9->_width + lVar8);
              uVar10 = pCVar5->_width;
              if ((((uVar10 == 1) && (*(int *)((long)&pCVar9->_height + lVar8) == 1)) &&
                  (*(int *)((long)&pCVar9->_depth + lVar8) == 1)) &&
                 (((local_38->_width == 1 && (local_38->_height == 1)) && (local_38->_depth == 1))))
              {
                memcpy(local_38->_data + uVar13,pvVar6,
                       (ulong)*(uint *)((long)&pCVar9->_spectrum + lVar8));
                pCVar12 = local_48;
              }
              else {
                CImg<char>::draw_image
                          (local_38,(int)((float)(uVar11 - uVar10) * local_3c),
                           (int)((float)(uVar14 - *(int *)((long)&pCVar9->_height + lVar8)) *
                                local_3c),
                           (int)((float)(uVar16 - *(int *)((long)&pCVar9->_depth + lVar8)) *
                                local_3c),(int)uVar13,pCVar5,1.0);
                pCVar12 = local_48;
              }
            }
            uVar13 = (ulong)(uint)((int)uVar13 + *(int *)((long)&pCVar9->_spectrum + lVar8));
            lVar15 = lVar15 + 1;
            lVar8 = lVar8 + 0x20;
            __return_storage_ptr__ = local_38;
          } while (lVar15 < (int)pCVar12->_width);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CImg<T> get_append(const char axis, const float align=0) const {
      if (is_empty()) return CImg<T>();
      if (_width==1) return +((*this)[0]);
      unsigned int dx = 0, dy = 0, dz = 0, dc = 0, pos = 0;
      CImg<T> res;
      switch (cimg::lowercase(axis)) {
      case 'x' : { // Along the X-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx+=img._width;
            dy = std::max(dy,img._height);
            dz = std::max(dz,img._depth);
            dc = std::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._height==1 && img._depth==1 && img._spectrum==1 &&
                  res._height==1 && res._depth==1 && res._spectrum==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._width);
              else
                res.draw_image(pos,
                               (int)(align*(dy - img._height)),
                               (int)(align*(dz - img._depth)),
                               (int)(align*(dc - img._spectrum)),
                               img);
            }
            pos+=img._width;
          }
      } break;
      case 'y' : { // Along the Y-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = std::max(dx,img._width);
            dy+=img._height;
            dz = std::max(dz,img._depth);
            dc = std::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._width==1 && img._depth==1 && img._spectrum==1 &&
                  res._width==1 && res._depth==1 && res._spectrum==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._height);
              else
                res.draw_image((int)(align*(dx - img._width)),
                               pos,
                               (int)(align*(dz - img._depth)),
                               (int)(align*(dc - img._spectrum)),
                               img);
            }
            pos+=img._height;
          }
      } break;
      case 'z' : { // Along the Z-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = std::max(dx,img._width);
            dy = std::max(dy,img._height);
            dz+=img._depth;
            dc = std::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._width==1 && img._height==1 && img._spectrum==1 &&
                  res._width==1 && res._height==1 && res._spectrum==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._depth);
              else
                res.draw_image((int)(align*(dx - img._width)),
                               (int)(align*(dy - img._height)),
                               pos,
                               (int)(align*(dc - img._spectrum)),
                               img);
            }
            pos+=img._depth;
          }
      } break;
      default : { // Along the C-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = std::max(dx,img._width);
            dy = std::max(dy,img._height);
            dz = std::max(dz,img._depth);
            dc+=img._spectrum;
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._width==1 && img._height==1 && img._depth==1 &&
                  res._width==1 && res._height==1 && res._depth==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._spectrum);
              else
                res.draw_image((int)(align*(dx - img._width)),
                               (int)(align*(dy - img._height)),
                               (int)(align*(dz - img._depth)),
                               pos,
                               img);
            }
            pos+=img._spectrum;
          }
      }
      }
      return res;
    }